

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumper.c
# Opt level: O0

void yaml_emitter_anchor_node(yaml_emitter_t *emitter,int index)

{
  yaml_node_t *pyVar1;
  int iVar2;
  int *local_30;
  yaml_node_pair_t *pair;
  yaml_node_item_t *item;
  yaml_node_t *node;
  int index_local;
  yaml_emitter_t *emitter_local;
  
  pyVar1 = (emitter->document->nodes).start;
  emitter->anchors[index + -1].references = emitter->anchors[index + -1].references + 1;
  if (emitter->anchors[index + -1].references == 1) {
    if (pyVar1[(long)index + -1].type == YAML_SEQUENCE_NODE) {
      for (pair = pyVar1[(long)index + -1].data.mapping.pairs.start;
          pair < (yaml_node_pair_t *)pyVar1[(long)index + -1].data.sequence.items.top;
          pair = (yaml_node_pair_t *)&pair->value) {
        yaml_emitter_anchor_node(emitter,pair->key);
      }
    }
    else if (pyVar1[(long)index + -1].type == YAML_MAPPING_NODE) {
      for (local_30 = pyVar1[(long)index + -1].data.sequence.items.start;
          local_30 < pyVar1[(long)index + -1].data.sequence.items.top; local_30 = local_30 + 2) {
        yaml_emitter_anchor_node(emitter,*local_30);
        yaml_emitter_anchor_node(emitter,local_30[1]);
      }
    }
  }
  else if (emitter->anchors[index + -1].references == 2) {
    iVar2 = emitter->last_anchor_id + 1;
    emitter->last_anchor_id = iVar2;
    emitter->anchors[index + -1].anchor = iVar2;
  }
  return;
}

Assistant:

static void
yaml_emitter_anchor_node(yaml_emitter_t *emitter, int index)
{
    yaml_node_t *node = emitter->document->nodes.start + index - 1;
    yaml_node_item_t *item;
    yaml_node_pair_t *pair;

    emitter->anchors[index-1].references ++;

    if (emitter->anchors[index-1].references == 1) {
        switch (node->type) {
            case YAML_SEQUENCE_NODE:
                for (item = node->data.sequence.items.start;
                        item < node->data.sequence.items.top; item ++) {
                    yaml_emitter_anchor_node(emitter, *item);
                }
                break;
            case YAML_MAPPING_NODE:
                for (pair = node->data.mapping.pairs.start;
                        pair < node->data.mapping.pairs.top; pair ++) {
                    yaml_emitter_anchor_node(emitter, pair->key);
                    yaml_emitter_anchor_node(emitter, pair->value);
                }
                break;
            default:
                break;
        }
    }

    else if (emitter->anchors[index-1].references == 2) {
        emitter->anchors[index-1].anchor = (++ emitter->last_anchor_id);
    }
}